

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O0

err_t btokSMCmdUnwrap(apdu_cmd_t *cmd,size_t *size,octet *apdu,size_t count,void *state)

{
  bool_t bVar1;
  size_t sVar2;
  ulong in_RCX;
  byte *in_RDX;
  size_t *in_RSI;
  byte *in_RDI;
  octet *in_R8;
  size_t rdf_len_len;
  octet *val;
  btok_sm_st *st;
  octet *mac;
  size_t rdf_len;
  octet *cdf;
  size_t cdf_len_len;
  size_t cdf_len;
  size_t c3;
  size_t c2;
  size_t c1;
  size_t offset;
  size_t len;
  undefined4 in_stack_ffffffffffffff68;
  u32 in_stack_ffffffffffffff6c;
  byte *in_stack_ffffffffffffff70;
  octet *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  u32 in_stack_ffffffffffffff84;
  octet **in_stack_ffffffffffffff88;
  ulong count_00;
  octet *in_stack_ffffffffffffff90;
  apdu_cmd_t *in_stack_ffffffffffffff98;
  octet **val_00;
  ulong local_60;
  size_t local_50;
  size_t local_48;
  ulong local_38;
  err_t local_4;
  
  if ((((in_RCX < 4) || ((in_R8 != (octet *)0x0 && (in_RCX < 0x10)))) ||
      ((in_R8 != (octet *)0x0 && ((*in_RDX & 4) == 0)))) ||
     ((in_R8 == (octet *)0x0 && ((*in_RDX & 4) != 0)))) {
    local_4 = 0x138;
  }
  else if (in_R8 == (octet *)0x0) {
    sVar2 = apduCmdDec(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       (size_t)in_stack_ffffffffffffff88);
    if (sVar2 == 0xffffffffffffffff) {
      local_4 = 0x138;
    }
    else {
      if (in_RSI != (size_t *)0x0) {
        *in_RSI = sVar2;
      }
      local_4 = 0;
    }
  }
  else {
    if (in_RDX[4] == 0) {
      local_38 = (ulong)in_RDX[6] + (ulong)in_RDX[5] * 0x100;
      val_00 = (octet **)0x3;
    }
    else {
      local_38 = (ulong)in_RDX[4];
      val_00 = (octet **)0x1;
    }
    if (((long)val_00 + local_38 + 5 == in_RCX) &&
       (bVar1 = memIsZero(in_RDX + 4 + (long)val_00 + local_38,1), bVar1 != 0)) {
      local_48 = derDec2(in_stack_ffffffffffffff88,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff6c);
      if (local_48 == 0xffffffffffffffff) {
        local_60 = 0;
        local_48 = 0;
      }
      else {
        if ((local_60 < 2) || (*in_stack_ffffffffffffff90 != '\x02')) {
          return 0x138;
        }
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1;
        local_60 = local_60 - 1;
      }
      local_50 = derDec2(in_stack_ffffffffffffff88,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff6c);
      if (local_50 == 0xffffffffffffffff) {
        count_00 = 0;
        local_50 = 0;
      }
      else {
        if ((CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68) == 0) ||
           (3 < CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))) {
          return 0x138;
        }
        if (CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68) == 1) {
          count_00 = (ulong)*in_stack_ffffffffffffff70;
          if (count_00 == 0) {
            count_00 = 0x100;
          }
          if (0xff < local_60) {
            return 0x138;
          }
        }
        else if (CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68) == 2) {
          count_00 = (ulong)in_stack_ffffffffffffff70[1] + (ulong)*in_stack_ffffffffffffff70 * 0x100
          ;
          if (count_00 == 0) {
            count_00 = 0x10000;
          }
          if (((local_60 < 0x100) && (count_00 < 0x101)) || (local_60 == 0)) {
            return 0x138;
          }
        }
        else {
          count_00 = (ulong)in_stack_ffffffffffffff70[2] +
                     (ulong)in_stack_ffffffffffffff70[1] * 0x100;
          if (count_00 == 0) {
            count_00 = 0x10000;
          }
          if (((*in_stack_ffffffffffffff70 != 0) || (local_60 != 0)) || (count_00 < 0x101)) {
            return 0x138;
          }
        }
      }
      sVar2 = derDec3(val_00,in_stack_ffffffffffffff90,count_00,in_stack_ffffffffffffff84,
                      (size_t)in_stack_ffffffffffffff78);
      if ((sVar2 == 0xffffffffffffffff) || (local_48 + local_50 + sVar2 != local_38)) {
        local_4 = 0x138;
      }
      else if (in_RDI == (byte *)0x0) {
        if (in_RSI != (size_t *)0x0) {
          *in_RSI = local_60 + 0x18;
        }
        local_4 = 0;
      }
      else if ((uint)in_R8[0x40] % 2 == 1) {
        beltMACStart((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_R8,
                     (size_t)in_stack_ffffffffffffff70);
        beltMACStepA((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (size_t)in_R8,in_stack_ffffffffffffff70);
        beltMACStepA((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (size_t)in_R8,in_stack_ffffffffffffff70);
        beltMACStepA((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (size_t)in_R8,in_stack_ffffffffffffff70);
        bVar1 = beltMACStepV(in_stack_ffffffffffffff70,
                             (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (bVar1 == 0) {
          local_4 = 0x1ff;
        }
        else {
          memSet(in_stack_ffffffffffffff70,(octet)(in_stack_ffffffffffffff6c >> 0x18),0x163162);
          *in_RDI = *in_RDX & 0xfb;
          in_RDI[1] = in_RDX[1];
          in_RDI[2] = in_RDX[2];
          in_RDI[3] = in_RDX[3];
          *(ulong *)(in_RDI + 8) = count_00;
          *(ulong *)(in_RDI + 0x10) = local_60;
          memCopy(in_stack_ffffffffffffff70,
                  (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0x1631f1);
          if (local_60 != 0) {
            beltCFBStart((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_R8
                         ,(size_t)in_stack_ffffffffffffff70,
                         (octet *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            beltCFBStepD((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (size_t)in_R8,in_stack_ffffffffffffff70);
          }
          if (in_RSI != (size_t *)0x0) {
            *in_RSI = *(long *)(in_RDI + 0x10) + 0x18;
          }
          local_4 = 0;
        }
      }
      else {
        local_4 = 0x205;
      }
    }
    else {
      local_4 = 0x138;
    }
  }
  return local_4;
}

Assistant:

err_t btokSMCmdUnwrap(apdu_cmd_t* cmd, size_t* size, const octet apdu[],
	size_t count, void* state)
{
	size_t len;
	size_t offset;
	size_t c1, c2, c3;
	size_t cdf_len;
	size_t cdf_len_len;
	const octet* cdf;
	size_t rdf_len;
	const octet* mac;
	btok_sm_st* st;
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(state, btokSM_keep()));
	ASSERT(memIsNullOrValid(cmd, sizeof(apdu_cmd_t)));
	// слишком короткая команда?
	// нужно снять защиту с незащищенной команды?
	// невозможно снять защиту?
	if (count < 4 || state && count < 16 ||
		state && (apdu[0] & 0x04) == 0 ||
		!state && (apdu[0] & 0x04) != 0)
		return ERR_BAD_APDU;
	// декодировать без снятия защиты?
	if (!state)
	{
		offset = apduCmdDec(cmd, apdu, count);
		if (offset == SIZE_MAX)
			return ERR_BAD_APDU;
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			ASSERT(cmd == 0 ||
				memIsDisjoint2(size, O_PER_S, cmd, apduCmdSizeof(cmd)));
			*size = offset;
		}
		return ERR_OK;
	}
	ASSERT(memIsDisjoint2(state, btokSM_keep(), apdu, count));
	// разобрать длину защищенного поля cdf
	if (apdu[4] != 0)
	{
		len = apdu[4];
		cdf_len_len = 1;
	}
	else
	{
		len = apdu[5], len *= 256, len += apdu[6];
		cdf_len_len = 3;
	}
	offset = 4 + cdf_len_len;
	// проверить длину кода, а также его завершение (Le*)
	if (4 + cdf_len_len + len + 1 != count ||
		!memIsZero(apdu + 4 + cdf_len_len + len, 1))
		return ERR_BAD_APDU;
	// разобрать защищенное поле cdf: шифртекст
	c1 = derDec2(&cdf, &cdf_len, apdu + offset, len, 0x87);
	if (c1 != SIZE_MAX)
	{
		if (cdf_len < 2 || cdf[0] != 0x02)
			return ERR_BAD_APDU;
		++cdf, --cdf_len;
	}
	else
		c1 = cdf_len = 0;
	// разобрать защищенное поле cdf: rdf_len
	{
		const octet* val;
		size_t rdf_len_len;
		c2 = derDec2(&val, &rdf_len_len, apdu + offset + c1, len - c1, 0x97);
		if (c2 != SIZE_MAX)
		{
			if (rdf_len_len == 0 || rdf_len_len > 3)
				return ERR_BAD_APDU;
			else if (rdf_len_len == 1)
			{
				rdf_len = val[0];
				if (rdf_len == 0)
					rdf_len = 256;
				if (cdf_len >= 256)
					return ERR_BAD_APDU;
			}
			else if (rdf_len_len == 2)
			{
				rdf_len = val[0], rdf_len *= 256, rdf_len += val[1];
				if (rdf_len == 0)
					rdf_len = 65536;
				if (cdf_len < 256 && rdf_len <= 256 || cdf_len == 0)
					return ERR_BAD_APDU;
			}
			else
			{
				rdf_len = val[1], rdf_len *= 256, rdf_len += val[2];
				if (rdf_len == 0)
					rdf_len = 65536;
				if (val[0] != 0 || cdf_len != 0 || rdf_len <= 256)
					return ERR_BAD_APDU;
			}
		}
		else
			c2 = rdf_len = 0;
	}
	// разобрать защищенное поле cdf: имитовставка
	c3 = derDec3(&mac, apdu + offset + c1 + c2, len - c1 - c2, 0x8E, 8);
	if (c3 == SIZE_MAX || c1 + c2 + c3 != len)
		return ERR_BAD_APDU;
	// ограничиться проверкой формата?
	if (!cmd)
	{
		if (size)
		{
			ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
			*size = sizeof(apdu_cmd_t) + cdf_len;
		}
		return ERR_OK;
	}
	// проверить счетчик
	st = (btok_sm_st*)state;
	if (st->ctr[0] % 2 != 1)
		return ERR_BAD_LOGIC;
	// проверить имитовставку
	beltMACStart(st->stack, st->key1, 32);
	beltMACStepA(st->ctr, 16, st->stack);
	beltMACStepA(apdu, 4, st->stack);
	beltMACStepA(apdu + offset, c1 + c2, st->stack);
	if (!beltMACStepV(mac, st->stack))
		return ERR_BAD_MAC;
	// заполнить поля команды
	memSetZero(cmd, sizeof(apdu_cmd_t));
	cmd->cla = apdu[0] & 0xFB;
	cmd->ins = apdu[1], cmd->p1 = apdu[2], cmd->p2 = apdu[3];
	cmd->rdf_len = rdf_len;
	cmd->cdf_len = cdf_len;
	memCopy(cmd->cdf, cdf, cdf_len);
	ASSERT(memIsDisjoint2(cmd, apduCmdSizeof(cmd), state, btokSM_keep()));
	ASSERT(memIsDisjoint2(cmd, apduCmdSizeof(cmd), apdu, count));
	// расшифровать cdf
	if (cdf_len)
	{
		beltCFBStart(st->stack, st->key2, 32, st->ctr);
		beltCFBStepD(cmd->cdf, cdf_len, st->stack);
	}
	// возвратить размер
	if (size)
	{
		ASSERT(memIsDisjoint2(size, O_PER_S, state, btokSM_keep()));
		ASSERT(memIsDisjoint2(size, O_PER_S, apdu, count));
		ASSERT(memIsDisjoint2(size, O_PER_S, cmd, apduCmdSizeof(cmd)));
		*size = apduCmdSizeof(cmd);
	}
	// завершить
	return ERR_OK;
}